

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  void *pvVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  ParamDictPrivate *pPVar7;
  int **ppiVar8;
  long lVar9;
  char *pcVar10;
  Mat *this_00;
  int iVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  int id;
  int len;
  int v_1;
  int v;
  char vstr [16];
  char comma [4];
  char vstr_1 [16];
  undefined1 local_1ac [4];
  int **local_1a8;
  iterator iStack_1a0;
  int *local_198;
  long lStack_190;
  ParamDict *local_188;
  int local_180;
  int local_17c;
  char local_178 [24];
  long *local_160 [2];
  long local_150 [2];
  undefined1 local_13c [4];
  vector<float,_std::allocator<float>_> local_138 [10];
  char local_47;
  
  clear(this);
  local_1ac = (undefined1  [4])0x0;
  iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d=");
  local_188 = this;
  do {
    if (iVar4 != 1) {
      return 0;
    }
    if ((int)local_1ac < -0x5b03) {
      iVar4 = -(int)local_1ac;
      bVar14 = (uint)local_1ac < 0xffffa4dd;
      local_1ac = (undefined1  [4])(iVar4 - 0x5b04);
      if (bVar14) goto LAB_00145643;
      local_1a8 = (int **)((ulong)local_1a8 & 0xffffffff00000000);
      iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_1a8);
      if (iVar4 != 1) {
        load_param();
        goto LAB_0014521d;
      }
      Mat::create(&this->d->params[(int)local_1ac].v,(int)local_1a8,4,(Allocator *)0x0);
      bVar14 = false;
      if (0 < (int)local_1a8) {
        lVar9 = 0;
        lVar13 = 0;
        do {
          iVar4 = (*dr->_vptr_DataReader[2])(dr,",%15[^,\n ]",local_138);
          if (iVar4 != 1) {
            load_param();
LAB_00145591:
            fputc(10,_stderr);
            bVar14 = true;
            goto LAB_001454e6;
          }
          bVar14 = vstr_is_float((char *)local_138);
          pPVar7 = this->d;
          lVar12 = (long)(int)local_1ac;
          pvVar1 = pPVar7->params[lVar12].v.data;
          if (bVar14) {
            fVar15 = vstr_to_float((char *)local_138);
            *(float *)((long)pvVar1 + lVar9) = fVar15;
            iVar4 = 6;
          }
          else {
            iVar4 = __isoc99_sscanf(local_138,"%d",(long)pvVar1 + lVar9);
            if (iVar4 != 1) {
              load_param();
              this = local_188;
              goto LAB_00145591;
            }
            pPVar7 = local_188->d;
            lVar12 = (long)(int)local_1ac;
            iVar4 = 5;
          }
          pPVar7->params[lVar12].type = iVar4;
          lVar13 = lVar13 + 1;
          lVar9 = lVar9 + 4;
          this = local_188;
        } while (lVar13 < (int)local_1a8);
        bVar14 = false;
      }
    }
    else {
      if (0x1f < (int)local_1ac) {
LAB_00145643:
        load_param((ParamDict *)(ulong)(uint)local_1ac);
        return -1;
      }
      iVar4 = (*dr->_vptr_DataReader[2])(dr,"%15[^,\n ]",local_178);
      cVar3 = local_178[0];
      if (iVar4 == 1) {
        iVar11 = (int)local_178[0];
        iVar4 = isalpha(iVar11);
        if ((iVar11 != 0x22) && (iVar4 == 0)) {
          bVar14 = vstr_is_float(local_178);
          iVar4 = (*dr->_vptr_DataReader[2])(dr,"%1[,]",local_13c);
          this = local_188;
          if (iVar4 == 1) {
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (float *)0x0;
            local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (float *)0x0;
            local_198 = (int *)0x0;
            local_1a8 = (int **)0x0;
            iStack_1a0._M_current = (int *)0x0;
            if (bVar14) {
              fVar15 = vstr_to_float(local_178);
              local_160[0] = (long *)CONCAT44(local_160[0]._4_4_,fVar15);
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (local_138,(iterator)0x0,(float *)local_160);
            }
            else {
              local_17c = 0;
              iVar4 = __isoc99_sscanf(local_178,"%d",&local_17c);
              if (iVar4 != 1) {
                load_param();
LAB_001455ed:
                this = local_188;
                if (local_1a8 != (int **)0x0) {
                  operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
                }
                if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_138[0].
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_138[0].
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                goto LAB_0014521d;
              }
              if (iStack_1a0._M_current == local_198) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1a8,iStack_1a0,&local_17c);
              }
              else {
                *iStack_1a0._M_current = local_17c;
                iStack_1a0._M_current = iStack_1a0._M_current + 1;
              }
            }
            do {
              iVar4 = (*dr->_vptr_DataReader[2])(dr,"%15[^,\n ]",local_178);
              if (iVar4 != 1) break;
              if (bVar14) {
                fVar15 = vstr_to_float(local_178);
                local_160[0] = (long *)CONCAT44(local_160[0]._4_4_,fVar15);
                if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (local_138,
                             (iterator)
                             local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_160);
                }
                else {
                  *local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = fVar15;
                  local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              else {
                local_180 = 0;
                iVar4 = __isoc99_sscanf(local_178,"%d",&local_180);
                if (iVar4 != 1) {
                  load_param();
                  goto LAB_001455ed;
                }
                if (iStack_1a0._M_current == local_198) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_1a8,iStack_1a0,&local_180);
                }
                else {
                  *iStack_1a0._M_current = local_180;
                  iStack_1a0._M_current = iStack_1a0._M_current + 1;
                }
              }
              iVar4 = (*dr->_vptr_DataReader[2])(dr,"%1[,]",local_13c);
            } while (iVar4 == 1);
            this_00 = &local_188->d->params[(int)local_1ac].v;
            if (bVar14) {
              Mat::create(this_00,(int)((ulong)((long)local_138[0].
                                                                                                            
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_138[0].
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2),4,
                          (Allocator *)0x0);
              this = local_188;
              memcpy(local_188->d->params[(int)local_1ac].v.data,
                     local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start);
              iVar4 = 6;
            }
            else {
              Mat::create(this_00,(int)((ulong)((long)iStack_1a0._M_current - (long)local_1a8) >> 2)
                          ,4,(Allocator *)0x0);
              this = local_188;
              memcpy(local_188->d->params[(int)local_1ac].v.data,local_1a8,
                     (long)iStack_1a0._M_current - (long)local_1a8);
              iVar4 = 5;
            }
            this->d->params[(int)local_1ac].type = iVar4;
            if (local_1a8 != (int **)0x0) {
              operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
            }
            if (local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138[0].super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_138[0].super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            if (bVar14) {
              fVar15 = vstr_to_float(local_178);
              local_188->d->params[(int)local_1ac].field_1.f = fVar15;
              iVar11 = 3;
              this = local_188;
            }
            else {
              iVar4 = __isoc99_sscanf(local_178,"%d",&local_188->d->params[(int)local_1ac].field_1);
              iVar11 = 2;
              if (iVar4 != 1) {
                load_param();
                goto LAB_0014521d;
              }
            }
            this->d->params[(int)local_1ac].type = iVar11;
          }
          bVar14 = false;
          goto LAB_001454e6;
        }
        local_47 = '\0';
        pcVar10 = "%255[^\n ]";
        if (cVar3 == '\"') {
          pcVar10 = "%255[^\"\n]\"";
        }
        iVar4 = (*dr->_vptr_DataReader[2])(dr,pcVar10,local_138);
        this = local_188;
        if (iVar4 != 1) {
          if (local_178[0] == '\"') {
            pcVar10 = local_178 + 1;
            local_1a8 = &local_198;
            sVar5 = strlen(pcVar10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,pcVar10,pcVar10 + sVar5);
            std::__cxx11::string::operator=
                      ((string *)&this->d->params[(int)local_1ac].s,(string *)&local_1a8);
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,(long)local_198 + 1);
            }
          }
          else {
            local_1a8 = &local_198;
            sVar5 = strlen(local_178);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a8,local_178,local_178 + sVar5);
            std::__cxx11::string::operator=
                      ((string *)&this->d->params[(int)local_1ac].s,(string *)&local_1a8);
            if (local_1a8 != &local_198) {
              operator_delete(local_1a8,(long)local_198 + 1);
            }
          }
          goto LAB_00145491;
        }
        if (local_47 != '\0') {
          load_param((ParamDict *)local_1ac);
          goto LAB_0014521d;
        }
        if (local_178[0] == '\"') {
          local_160[0] = local_150;
          pcVar10 = local_178 + 1;
          sVar5 = strlen(pcVar10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_160,pcVar10,pcVar10 + sVar5);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_160);
          ppiVar8 = (int **)(plVar6 + 2);
          if ((int **)*plVar6 == ppiVar8) {
            local_198 = *ppiVar8;
            lStack_190 = plVar6[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *ppiVar8;
            local_1a8 = (int **)*plVar6;
          }
          iStack_1a0._M_current = (int *)plVar6[1];
          *plVar6 = (long)ppiVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)&this->d->params[(int)local_1ac].s,(string *)&local_1a8);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,(long)local_198 + 1);
          }
          if (local_160[0] != local_150) {
LAB_00145484:
            operator_delete(local_160[0],local_150[0] + 1);
          }
        }
        else {
          local_160[0] = local_150;
          sVar5 = strlen(local_178);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_160,local_178,local_178 + sVar5);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_160);
          ppiVar8 = (int **)(plVar6 + 2);
          if ((int **)*plVar6 == ppiVar8) {
            local_198 = *ppiVar8;
            lStack_190 = plVar6[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *ppiVar8;
            local_1a8 = (int **)*plVar6;
          }
          iStack_1a0._M_current = (int *)plVar6[1];
          *plVar6 = (long)ppiVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::operator=
                    ((string *)&this->d->params[(int)local_1ac].s,(string *)&local_1a8);
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,(long)local_198 + 1);
          }
          if (local_160[0] != local_150) goto LAB_00145484;
        }
LAB_00145491:
        pPVar7 = this->d;
        lVar9 = (long)(int)local_1ac;
        sVar2 = pPVar7->params[lVar9].s._M_string_length;
        if (pPVar7->params[lVar9].s._M_dataplus._M_p[sVar2 - 1] == '\"') {
          std::__cxx11::string::resize((ulong)&pPVar7->params[lVar9].s,(char)sVar2 + -1);
          pPVar7 = this->d;
          lVar9 = (long)(int)local_1ac;
        }
        pPVar7->params[lVar9].type = 7;
        bVar14 = false;
      }
      else {
        load_param();
LAB_0014521d:
        bVar14 = true;
      }
    }
LAB_001454e6:
    if (bVar14) {
      return -1;
    }
    iVar4 = (*dr->_vptr_DataReader[2])(dr,"%d=",local_1ac);
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    // 0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0
    // 3=0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            // old style array
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }

            continue;
        }

        char vstr[16];
        char comma[4];
        int nscan = dr.scan("%15[^,\n ]", vstr);
        if (nscan != 1)
        {
            NCNN_LOGE("ParamDict read value failed");
            return -1;
        }

        bool is_string = vstr_is_string(vstr);
        if (is_string)
        {
            // scan the remaining string
            char vstr2[256];
            vstr2[241] = '\0'; // max 255 = 15 + 240
            if (vstr[0] == '\"')
            {
                nscan = dr.scan("%255[^\"\n]\"", vstr2);
            }
            else
            {
                nscan = dr.scan("%255[^\n ]", vstr2);
            }
            if (nscan == 1)
            {
                if (vstr2[241] != '\0')
                {
                    NCNN_LOGE("string too long (id=%d)", id);
                    return -1;
                }

                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]) + vstr2;
                else
                    d->params[id].s = std::string(vstr) + vstr2;
            }
            else
            {
                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]);
                else
                    d->params[id].s = std::string(vstr);
            }

            if (d->params[id].s[d->params[id].s.size() - 1] == '\"')
                d->params[id].s.resize(d->params[id].s.size() - 1);

            d->params[id].type = 7;

            continue;
        }

        bool is_float = vstr_is_float(vstr);

        nscan = dr.scan("%1[,]", comma);
        is_array = nscan == 1;

        if (is_array)
        {
            std::vector<float> af;
            std::vector<int> ai;

            if (is_float)
            {
                af.push_back(vstr_to_float(vstr));
            }
            else
            {
                int v = 0;
                nscan = sscanf(vstr, "%d", &v);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }

                ai.push_back(v);
            }

            while (1)
            {
                nscan = dr.scan("%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    break;
                }

                if (is_float)
                {
                    af.push_back(vstr_to_float(vstr));
                }
                else
                {
                    int v = 0;
                    nscan = sscanf(vstr, "%d", &v);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse value failed");
                        return -1;
                    }

                    ai.push_back(v);
                }

                nscan = dr.scan("%1[,]", comma);
                if (nscan != 1)
                {
                    break;
                }
            }

            if (is_float)
            {
                d->params[id].v.create((int)af.size());
                memcpy(d->params[id].v.data, af.data(), af.size() * 4);
            }
            else
            {
                d->params[id].v.create((int)ai.size());
                memcpy(d->params[id].v.data, ai.data(), ai.size() * 4);
            }

            d->params[id].type = is_float ? 6 : 5;
        }
        else
        {
            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}